

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_slice(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int splice)

{
  JSValue val_00;
  JSValue val_01;
  int iVar1;
  JSValueUnion JVar2;
  JSValueUnion JVar3;
  JSValueUnion JVar4;
  int64_t *piVar5;
  ulong uVar6;
  ulong uVar7;
  JSValueUnion JVar8;
  int64_t iVar9;
  int64_t iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  JSValue JVar15;
  JSValue JVar16;
  JSValue len_val;
  JSValue prop;
  JSValue prop_00;
  JSValue val_02;
  JSValue val_03;
  JSValue val_04;
  int64_t del_count;
  int64_t start;
  int64_t final;
  int64_t len;
  JSValue val;
  ulong local_80;
  int64_t *local_78;
  int64_t *local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  JSValueUnion local_48;
  int64_t iStack_40;
  
  JVar15 = JS_ToObject(ctx,this_val);
  JVar2 = JVar15.u;
  iVar1 = js_get_length64(ctx,(int64_t *)&local_50,JVar15);
  if (iVar1 != 0) {
    JVar16 = (JSValue)(ZEXT816(3) << 0x40);
    uVar13 = 0;
    goto LAB_0016703c;
  }
  iVar1 = JS_ToInt64Clamp(ctx,(int64_t *)&local_78,*argv,0,local_50,local_50);
  if (iVar1 != 0) {
LAB_00167031:
    uVar13 = 0;
    JVar16 = (JSValue)(ZEXT816(3) << 0x40);
    goto LAB_0016703c;
  }
  if (splice == 0) {
    local_68 = local_50;
    if ((int)argv[1].tag != 3) {
      JVar16.tag = argv[1].tag;
      JVar16.u.ptr = argv[1].u.ptr;
      iVar1 = JS_ToInt64Clamp(ctx,(int64_t *)&local_68,JVar16,0,local_50,local_50);
      JVar16 = (JSValue)(ZEXT816(3) << 0x40);
      uVar13 = 0;
      if (iVar1 != 0) goto LAB_0016703c;
    }
    uVar13 = 0;
    uVar7 = local_68 - (long)local_78;
    if ((long)(local_68 - (long)local_78) < 1) {
      uVar7 = uVar13;
    }
  }
  else {
    if (argc == 1) {
      local_80 = local_50 - (long)local_78;
LAB_00167189:
      uVar11 = 0;
    }
    else {
      if (argc == 0) {
        local_80 = 0;
        goto LAB_00167189;
      }
      iVar1 = JS_ToInt64Clamp(ctx,(int64_t *)&local_80,argv[1],0,local_50 - (long)local_78,0);
      if (iVar1 != 0) goto LAB_00167031;
      uVar11 = argc - 2;
    }
    uVar13 = (ulong)uVar11;
    uVar7 = local_80;
    if (0x1fffffffffffff < (long)((uVar13 + local_50) - local_80)) {
      JS_ThrowTypeError(ctx,"Array loo long");
      goto LAB_00167031;
    }
  }
  bVar14 = (long)(int)uVar7 == uVar7;
  JVar8.float64 = (double)(long)uVar7;
  if (bVar14) {
    JVar8.ptr = (void *)(uVar7 & 0xffffffff);
  }
  iVar10 = 7;
  if (bVar14) {
    iVar10 = 0;
  }
  len_val.tag = iVar10;
  len_val.u.float64 = JVar8.float64;
  local_60 = uVar13;
  JVar16 = JS_ArraySpeciesCreate(ctx,JVar15,len_val);
  JVar3 = JVar16.u;
  uVar13 = (ulong)JVar3.ptr >> 0x20;
  if ((JVar16.tag & 0xffffffffU) == 6) goto LAB_0016703c;
  uVar7 = uVar7 + (long)local_78;
  bVar14 = true;
  if ((((uint)JVar15.tag == 0xffffffff) && (*(short *)((long)JVar2.ptr + 6) == 2)) &&
     ((*(byte *)((long)JVar2.ptr + 5) & 8) != 0)) {
    JVar8 = (JSValueUnion)((JSValueUnion *)((long)JVar2.ptr + 0x38))->ptr;
    uVar6 = (ulong)*(uint *)((long)JVar2.ptr + 0x40);
    bVar14 = false;
  }
  else {
    uVar6 = 0;
  }
  local_68 = uVar7;
  if (((bVar14) || ((int)JVar16.tag != -1)) ||
     ((*(short *)((long)JVar3.ptr + 6) != 2 || ((*(byte *)((long)JVar3.ptr + 5) & 8) == 0)))) {
LAB_00167363:
    JVar8.float64 = 0.0;
    piVar5 = local_78;
  }
  else {
    if ((long)uVar7 < (long)uVar6) {
      uVar6 = uVar7;
    }
    local_58 = (long)local_78 - uVar6;
    if ((long)uVar6 <= (long)local_78) goto LAB_00167363;
    local_70 = (int64_t *)((long)JVar8.ptr + (long)local_78 * 0x10 + 8);
    JVar8.float64 = 0.0;
    do {
      JVar3 = (JSValueUnion)((JSValueUnion *)(local_70 + -1))->ptr;
      iVar10 = *local_70;
      if (0xfffffff4 < (uint)iVar10) {
        *(int *)JVar3.ptr = *JVar3.ptr + 1;
      }
      JVar4.float64 = (double)JVar8.float64;
      if (JVar8.ptr < (void *)0x80000000) {
        JVar4.float64 = JVar8.float64 & 0xffffffff;
      }
      iVar9 = 7;
      if (JVar8.ptr < (void *)0x80000000) {
        iVar9 = 0;
      }
      val_00.tag = iVar10;
      val_00.u.ptr = JVar3.ptr;
      prop.tag = iVar9;
      prop.u.float64 = JVar4.float64;
      iVar1 = JS_DefinePropertyValueValue(ctx,JVar16,prop,val_00,0x4007);
      if (iVar1 < 0) goto LAB_0016703c;
      JVar8.float64 = JVar8.float64 + 1;
      local_70 = local_70 + 2;
    } while (local_58 + (long)JVar8.ptr != 0);
    piVar5 = (int64_t *)((long)local_78 + (long)JVar8.ptr);
  }
  local_70 = local_78;
  for (; (long)piVar5 < (long)uVar7; piVar5 = (int64_t *)((long)piVar5 + 1)) {
    iVar1 = JS_TryGetPropertyInt64(ctx,JVar15,(int64_t)piVar5,(JSValue *)&local_48);
    if (iVar1 < 0) goto LAB_0016703c;
    if (iVar1 != 0) {
      JVar3.float64 = (double)JVar8.float64;
      if (JVar8.ptr < (void *)0x80000000) {
        JVar3.float64 = JVar8.float64 & 0xffffffff;
      }
      iVar10 = 7;
      if (JVar8.ptr < (void *)0x80000000) {
        iVar10 = 0;
      }
      val_01.tag = iStack_40;
      val_01.u.float64 = local_48.float64;
      prop_00.tag = iVar10;
      prop_00.u.float64 = JVar3.float64;
      iVar1 = JS_DefinePropertyValueValue(ctx,JVar16,prop_00,val_01,0x4007);
      if (iVar1 < 0) goto LAB_0016703c;
    }
    JVar8.float64 = JVar8.float64 + 1;
  }
  JVar3.float64 = (double)JVar8.float64;
  if (JVar8.ptr < (void *)0x80000000) {
    JVar3 = JVar8;
  }
  iVar10 = 7;
  if (JVar8.ptr < (void *)0x80000000) {
    iVar10 = 0;
  }
  val_02.tag = iVar10;
  val_02.u.float64 = JVar3.float64;
  iVar1 = JS_SetPropertyInternal(ctx,JVar16,0x30,val_02,0x4000);
  piVar5 = local_70;
  if (-1 < iVar1) {
    if (splice == 0) {
LAB_00167546:
      JS_FreeValue(ctx,JVar15);
      return JVar16;
    }
    uVar6 = local_60 & 0xffffffff;
    uVar7 = (local_50 + uVar6) - local_80;
    if (local_80 == uVar6) {
LAB_00167498:
      if ((int)local_60 != 0) {
        lVar12 = 0;
        do {
          JVar8 = (JSValueUnion)((JSValueUnion *)((long)&argv[2].u + lVar12))->ptr;
          iVar10 = *(int64_t *)((long)&argv[2].tag + lVar12);
          if (0xfffffff4 < (uint)iVar10) {
            *(int *)JVar8.ptr = *JVar8.ptr + 1;
          }
          val_03.tag = iVar10;
          val_03.u.ptr = JVar8.ptr;
          iVar1 = JS_SetPropertyInt64(ctx,JVar15,(int64_t)piVar5,val_03);
          if (iVar1 < 0) goto LAB_0016703c;
          lVar12 = lVar12 + 0x10;
          piVar5 = (int64_t *)((long)piVar5 + 1);
        } while (uVar6 << 4 != lVar12);
      }
      bVar14 = (long)(int)uVar7 == uVar7;
      JVar8.float64 = (double)(long)uVar7;
      if (bVar14) {
        JVar8.ptr = (void *)(uVar7 & 0xffffffff);
      }
      iVar10 = 7;
      if (bVar14) {
        iVar10 = 0;
      }
      val_04.tag = iVar10;
      val_04.u.float64 = JVar8.float64;
      iVar1 = JS_SetPropertyInternal(ctx,JVar15,0x30,val_04,0x4000);
      if (-1 < iVar1) goto LAB_00167546;
    }
    else {
      iVar1 = JS_CopySubArray(ctx,JVar15,(long)local_70 + uVar6,local_80 + (long)local_70,
                              local_50 - (local_80 + (long)local_70),
                              (((long)uVar6 <= (long)local_80) - 1) +
                              (uint)((long)uVar6 <= (long)local_80));
      while (-1 < iVar1) {
        if ((long)local_50 <= (long)uVar7) goto LAB_00167498;
        local_50 = local_50 - 1;
        iVar1 = JS_DeletePropertyInt64(ctx,JVar15,local_50,0x4000);
      }
    }
  }
LAB_0016703c:
  if ((0xfffffff4 < (uint)JVar15.tag) &&
     (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar15);
  }
  JVar2.ptr = (void *)((ulong)JVar16.u.ptr & 0xffffffff | uVar13 << 0x20);
  if ((0xfffffff4 < (uint)JVar16.tag) &&
     (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
    JVar15.tag = JVar16.tag;
    JVar15.u.ptr = JVar2.ptr;
    __JS_FreeValueRT(ctx->rt,JVar15);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_array_slice(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv, int splice)
{
    JSValue obj, arr, val, len_val;
    int64_t len, start, k, final, n, count, del_count, new_len;
    int kPresent;
    JSValue *arrp;
    uint32_t count32, i, item_count;

    arr = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    if (JS_ToInt64Clamp(ctx, &start, argv[0], 0, len, len))
        goto exception;

    if (splice) {
        if (argc == 0) {
            item_count = 0;
            del_count = 0;
        } else
        if (argc == 1) {
            item_count = 0;
            del_count = len - start;
        } else {
            item_count = argc - 2;
            if (JS_ToInt64Clamp(ctx, &del_count, argv[1], 0, len - start, 0))
                goto exception;
        }
        if (len + item_count - del_count > MAX_SAFE_INTEGER) {
            JS_ThrowTypeError(ctx, "Array loo long");
            goto exception;
        }
        count = del_count;
    } else {
        item_count = 0; /* avoid warning */
        final = len;
        if (!JS_IsUndefined(argv[1])) {
            if (JS_ToInt64Clamp(ctx, &final, argv[1], 0, len, len))
                goto exception;
        }
        count = max_int64(final - start, 0);
    }
    len_val = JS_NewInt64(ctx, count);
    arr = JS_ArraySpeciesCreate(ctx, obj, len_val);
    JS_FreeValue(ctx, len_val);
    if (JS_IsException(arr))
        goto exception;

    k = start;
    final = start + count;
    n = 0;
    /* The fast array test on arr ensures that
       JS_CreateDataPropertyUint32() won't modify obj in case arr is
       an exotic object */
    /* Special case fast arrays */
    if (js_get_fast_array(ctx, obj, &arrp, &count32) &&
        js_is_fast_array(ctx, arr)) {
        /* XXX: should share code with fast array constructor */
        for (; k < final && k < count32; k++, n++) {
            if (JS_CreateDataPropertyUint32(ctx, arr, n, JS_DupValue(ctx, arrp[k]), JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    /* Copy the remaining elements if any (handle case of inherited properties) */
    for (; k < final; k++, n++) {
        kPresent = JS_TryGetPropertyInt64(ctx, obj, k, &val);
        if (kPresent < 0)
            goto exception;
        if (kPresent) {
            if (JS_CreateDataPropertyUint32(ctx, arr, n, val, JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    if (JS_SetProperty(ctx, arr, JS_ATOM_length, JS_NewInt64(ctx, n)) < 0)
        goto exception;

    if (splice) {
        new_len = len + item_count - del_count;
        if (item_count != del_count) {
            if (JS_CopySubArray(ctx, obj, start + item_count,
                                start + del_count, len - (start + del_count),
                                item_count <= del_count ? +1 : -1) < 0)
                goto exception;

            for (k = len; k-- > new_len; ) {
                if (JS_DeletePropertyInt64(ctx, obj, k, JS_PROP_THROW) < 0)
                    goto exception;
            }
        }
        for (i = 0; i < item_count; i++) {
            if (JS_SetPropertyInt64(ctx, obj, start + i, JS_DupValue(ctx, argv[i + 2])) < 0)
                goto exception;
        }
        if (JS_SetProperty(ctx, obj, JS_ATOM_length, JS_NewInt64(ctx, new_len)) < 0)
            goto exception;
    }
    JS_FreeValue(ctx, obj);
    return arr;

 exception:
    JS_FreeValue(ctx, obj);
    JS_FreeValue(ctx, arr);
    return JS_EXCEPTION;
}